

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall leveldb::Arena::AllocateAligned(Arena *this,size_t bytes)

{
  ulong bytes_00;
  long in_RSI;
  ulong *in_RDI;
  char *result;
  size_t needed;
  size_t slop;
  size_t current_mod;
  int align;
  Arena *local_48;
  char *local_38;
  
  if ((*in_RDI & 7) == 0) {
    local_48 = (Arena *)0x0;
  }
  else {
    local_48 = (Arena *)(8 - (*in_RDI & 7));
  }
  bytes_00 = (long)&local_48->alloc_ptr_ + in_RSI;
  if (in_RDI[1] < bytes_00) {
    local_38 = AllocateFallback(local_48,bytes_00);
  }
  else {
    local_38 = (char *)((long)&local_48->alloc_ptr_ + *in_RDI);
    *in_RDI = bytes_00 + *in_RDI;
    in_RDI[1] = in_RDI[1] - bytes_00;
  }
  return local_38;
}

Assistant:

char* Arena::AllocateAligned(size_t bytes) {
  const int align = (sizeof(void*) > 8) ? sizeof(void*) : 8;
  static_assert((align & (align - 1)) == 0,
                "Pointer size should be a power of 2");
  size_t current_mod = reinterpret_cast<uintptr_t>(alloc_ptr_) & (align - 1);
  size_t slop = (current_mod == 0 ? 0 : align - current_mod);
  size_t needed = bytes + slop;
  char* result;
  if (needed <= alloc_bytes_remaining_) {
    result = alloc_ptr_ + slop;
    alloc_ptr_ += needed;
    alloc_bytes_remaining_ -= needed;
  } else {
    // AllocateFallback always returned aligned memory
    result = AllocateFallback(bytes);
  }
  assert((reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0);
  return result;
}